

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O0

void __thiscall
phoenix_flm_t::phoenix_flm_t
          (phoenix_flm_t *this,kstream *p__io,kstruct *p__parent,phoenix_flm_t *p__root)

{
  phoenix_flm_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  phoenix_flm_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__phoenix_flm_t_002290b0;
  std::__cxx11::string::string((string *)&this->m_signature);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>>>
              *)&this->m_entries);
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,(nullptr_t)0x0);
  this->f_len_flm_store_header = false;
  this->f_len_flm_entry = false;
  _read(this);
  return;
}

Assistant:

phoenix_flm_t::phoenix_flm_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, phoenix_flm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_entries = nullptr;
    f_len_flm_store_header = false;
    f_len_flm_entry = false;
    _read();
}